

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

void Catch::restorePreviousSignalHandlers(void)

{
  undefined1 *__act;
  long lVar1;
  
  __act = oldSigActions;
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x10) {
    sigaction(*(int *)((long)&signalDefs + lVar1),(sigaction *)__act,(sigaction *)0x0);
    __act = (undefined1 *)((long)__act + 0x98);
  }
  sigaltstack((sigaltstack *)oldSigStack,(sigaltstack *)0x0);
  return;
}

Assistant:

static void restorePreviousSignalHandlers() {
        // We set signal handlers back to the previous ones. Hopefully
        // nobody overwrote them in the meantime, and doesn't expect
        // their signal handlers to live past ours given that they
        // installed them after ours..
        for (std::size_t i = 0; i < sizeof(signalDefs) / sizeof(SignalDefs); ++i) {
            sigaction(signalDefs[i].id, &oldSigActions[i], nullptr);
        }
        // Return the old stack
        sigaltstack(&oldSigStack, nullptr);
    }